

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

int Wlc_PrsCheckBitConst0(Wlc_Ntk_t *p,int NameId)

{
  Wlc_Obj_t *pWVar1;
  Wlc_Obj_t *pWVar2;
  ulong uVar3;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar4;
  
  if ((0 < NameId) && (NameId < p->nObjsAlloc)) {
    pWVar2 = p->pObjs;
    uVar3 = (ulong)(uint)NameId;
    if (pWVar2[uVar3].End != pWVar2[uVar3].Beg) {
      return 0;
    }
    do {
      pWVar1 = pWVar2 + uVar3;
      if ((*(ushort *)pWVar1 & 0x3f) != 7) {
        if ((*(ushort *)pWVar1 & 0x3f) != 6) {
          return 0;
        }
        return ~*(pWVar1->field_10).pFanins[0] & 1;
      }
      paVar4 = &pWVar1->field_10;
      if (2 < pWVar1->nFanins) {
        paVar4 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar4->pFanins[0];
      }
      uVar3 = (ulong)paVar4->Fanins[0];
    } while ((0 < (long)uVar3) && (paVar4->Fanins[0] < p->nObjsAlloc));
  }
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

int Wlc_PrsCheckBitConst0( Wlc_Ntk_t * p, int NameId )
{
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, NameId );
    int * pInits;
    if ( Wlc_ObjRange(pObj) != 1 )
        return 0;
    while ( pObj->Type == WLC_OBJ_BUF )
        pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
    if ( pObj->Type != WLC_OBJ_CONST )
        return 0;
    pInits = Wlc_ObjConstValue(pObj);
    return Abc_InfoHasBit((unsigned *)pInits, 0) == 0;
}